

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFilter.cpp
# Opt level: O0

void __thiscall
KFilter::KFilter(KFilter *this,MatrixXd *F,VectorXd *x,MatrixXd *P,MatrixXd *Q,MatrixXd *H,
                MatrixXd *R)

{
  Index IVar1;
  Matrix<double,__1,__1,_0,__1,__1> local_d0;
  Matrix<double,__1,__1,_0,__1,__1> local_b8;
  Matrix<double,__1,__1,_0,__1,__1> local_a0;
  Matrix<double,__1,__1,_0,__1,__1> local_88;
  Matrix<double,__1,_1,_0,__1,_1> local_70;
  Matrix<double,__1,__1,_0,__1,__1> local_60;
  MatrixXd *local_38;
  MatrixXd *H_local;
  MatrixXd *Q_local;
  MatrixXd *P_local;
  VectorXd *x_local;
  MatrixXd *F_local;
  KFilter *this_local;
  
  local_38 = H;
  H_local = Q;
  Q_local = P;
  P_local = (MatrixXd *)x;
  x_local = (VectorXd *)F;
  F_local = &this->F_;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->F_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Q_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->H_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  this->state_dimension_ = (int)IVar1;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  this->measurement_dimension_ = (int)IVar1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_60,F);
  setStateTransition(this,&local_60);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_60);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_70,x);
  setInitialState(this,&local_70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_70);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_88,P);
  setCovariance(this,&local_88);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_88);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_a0,Q);
  setProcessNoise(this,&local_a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_b8,H);
  setMeasurementFunction(this,&local_b8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_b8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_d0,R);
  setMeasurementNoise(this,&local_d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d0);
  return;
}

Assistant:

KFilter::KFilter(MatrixXd F,
                 VectorXd x,
                 MatrixXd P,
                 MatrixXd Q,
                 MatrixXd H,
                 MatrixXd R)
{
    state_dimension_ = x.rows();
    measurement_dimension_ = R.rows();
    // Use these functions instead of direct set so we can check dimensions
    setStateTransition(F);
    setInitialState(x);
    setCovariance(P);
    setProcessNoise(Q);
    setMeasurementFunction(H);
    setMeasurementNoise(R);
}